

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.h
# Opt level: O2

CBlockHeader * __thiscall CBlock::GetBlockHeader(CBlockHeader *__return_storage_ptr__,CBlock *this)

{
  long lVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  uint32_t uVar12;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CBlockHeader::CBlockHeader(__return_storage_ptr__);
  __return_storage_ptr__->nVersion = (this->super_CBlockHeader).nVersion;
  uVar9 = *(undefined8 *)
           (this->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems;
  uVar10 = *(undefined8 *)
            ((this->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems + 8);
  uVar11 = *(undefined8 *)
            ((this->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems + 0x18);
  *(undefined8 *)
   ((__return_storage_ptr__->hashPrevBlock).super_base_blob<256U>.m_data._M_elems + 0x10) =
       *(undefined8 *)
        ((this->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems + 0x10);
  *(undefined8 *)
   ((__return_storage_ptr__->hashPrevBlock).super_base_blob<256U>.m_data._M_elems + 0x18) = uVar11;
  *(undefined8 *)(__return_storage_ptr__->hashPrevBlock).super_base_blob<256U>.m_data._M_elems =
       uVar9;
  *(undefined8 *)((__return_storage_ptr__->hashPrevBlock).super_base_blob<256U>.m_data._M_elems + 8)
       = uVar10;
  uVar2 = *(undefined4 *)
           ((this->super_CBlockHeader).hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 4);
  uVar3 = *(undefined4 *)
           ((this->super_CBlockHeader).hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 8);
  uVar4 = *(undefined4 *)
           ((this->super_CBlockHeader).hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0xc);
  uVar5 = *(undefined4 *)
           ((this->super_CBlockHeader).hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x10);
  uVar6 = *(undefined4 *)
           ((this->super_CBlockHeader).hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x14);
  uVar7 = *(undefined4 *)
           ((this->super_CBlockHeader).hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x18);
  uVar8 = *(undefined4 *)
           ((this->super_CBlockHeader).hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x1c);
  *(undefined4 *)(__return_storage_ptr__->hashMerkleRoot).super_base_blob<256U>.m_data._M_elems =
       *(undefined4 *)
        (this->super_CBlockHeader).hashMerkleRoot.super_base_blob<256U>.m_data._M_elems;
  *(undefined4 *)
   ((__return_storage_ptr__->hashMerkleRoot).super_base_blob<256U>.m_data._M_elems + 4) = uVar2;
  *(undefined4 *)
   ((__return_storage_ptr__->hashMerkleRoot).super_base_blob<256U>.m_data._M_elems + 8) = uVar3;
  *(undefined4 *)
   ((__return_storage_ptr__->hashMerkleRoot).super_base_blob<256U>.m_data._M_elems + 0xc) = uVar4;
  *(undefined4 *)
   ((__return_storage_ptr__->hashMerkleRoot).super_base_blob<256U>.m_data._M_elems + 0x10) = uVar5;
  *(undefined4 *)
   ((__return_storage_ptr__->hashMerkleRoot).super_base_blob<256U>.m_data._M_elems + 0x14) = uVar6;
  *(undefined4 *)
   ((__return_storage_ptr__->hashMerkleRoot).super_base_blob<256U>.m_data._M_elems + 0x18) = uVar7;
  *(undefined4 *)
   ((__return_storage_ptr__->hashMerkleRoot).super_base_blob<256U>.m_data._M_elems + 0x1c) = uVar8;
  uVar12 = (this->super_CBlockHeader).nBits;
  __return_storage_ptr__->nTime = (this->super_CBlockHeader).nTime;
  __return_storage_ptr__->nBits = uVar12;
  __return_storage_ptr__->nNonce = (this->super_CBlockHeader).nNonce;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

CBlockHeader GetBlockHeader() const
    {
        CBlockHeader block;
        block.nVersion       = nVersion;
        block.hashPrevBlock  = hashPrevBlock;
        block.hashMerkleRoot = hashMerkleRoot;
        block.nTime          = nTime;
        block.nBits          = nBits;
        block.nNonce         = nNonce;
        return block;
    }